

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::Init(SQSharedState *this)

{
  void *pvVar1;
  SQString *pSVar2;
  SQUnsignedInteger SVar3;
  SQObjectPtr *val;
  SQSharedState *ss;
  undefined8 *in_RDI;
  SQSharedState *in_stack_fffffffffffff8e8;
  SQInteger nInitialSize;
  SQSharedState *in_stack_fffffffffffff8f0;
  SQTable *in_stack_fffffffffffff8f8;
  SQTable *x;
  SQSharedState *in_stack_fffffffffffff900;
  SQSharedState *ss_00;
  SQObjectPtr *in_stack_fffffffffffff918;
  SQObjectPtr *in_stack_fffffffffffff920;
  SQObjectPtr *this_00;
  SQTable *in_stack_fffffffffffff928;
  SQTable *this_01;
  SQRegFunction *funcz;
  SQSharedState *ss_01;
  undefined1 local_348 [32];
  SQObjectPtr local_328;
  undefined1 local_318 [32];
  SQObjectPtr local_2f8;
  SQObjectPtr local_2e8;
  SQObjectPtr local_2d8;
  SQObjectPtr local_2c8;
  SQObjectPtr local_2b8;
  SQObjectPtr local_2a8;
  SQObjectPtr local_298;
  SQObjectPtr local_288;
  SQObjectPtr local_278;
  SQObjectPtr local_268;
  SQObjectPtr local_258;
  SQObjectPtr local_248;
  SQObjectPtr local_238;
  SQObjectPtr local_228;
  SQObjectPtr local_218;
  SQObjectPtr local_208;
  SQObjectPtr local_1f8;
  SQObjectPtr local_1e8;
  SQObjectPtr local_1d8;
  SQObjectPtr local_1c8;
  SQObjectPtr local_1b8;
  SQObjectPtr local_1a8;
  SQObjectPtr local_198;
  SQObjectPtr local_188;
  SQObjectPtr local_178;
  SQObjectPtr local_168;
  SQObjectPtr local_158;
  SQObjectPtr local_148;
  SQObjectPtr local_138;
  SQObjectPtr local_128;
  SQObjectPtr local_118;
  SQObjectPtr local_108;
  SQObjectPtr local_f8;
  SQObjectPtr local_e8;
  SQObjectPtr local_d8;
  SQObjectPtr local_c8;
  SQObjectPtr local_b8;
  SQObjectPtr local_a8;
  SQObjectPtr local_98;
  SQObjectPtr local_88;
  SQObjectPtr local_78;
  SQObjectPtr local_68;
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  SQObjectPtr local_38 [2];
  SQObjectPtr local_18;
  
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x11] = 0;
  pvVar1 = sq_vm_malloc(0x13c13a);
  in_RDI[5] = pvVar1;
  SQStringTable::SQStringTable((SQStringTable *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8)
  ;
  pvVar1 = sq_vm_malloc(0x13c161);
  *in_RDI = pvVar1;
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)*in_RDI);
  pvVar1 = sq_vm_malloc(0x13c184);
  in_RDI[3] = pvVar1;
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)in_RDI[3]);
  pvVar1 = sq_vm_malloc(0x13c1a9);
  in_RDI[4] = pvVar1;
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)in_RDI[4]);
  SQTable::Create(in_stack_fffffffffffff8f0,(SQInteger)in_stack_fffffffffffff8e8);
  ::SQObjectPtr::operator=((SQObjectPtr *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_18,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(local_38,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_48,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_58,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_68,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_78,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_88,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_98,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_a8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_b8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_c8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_d8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_e8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_f8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_108,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_118,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_128,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_138,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_148,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_158,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_168,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_178,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_188,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_198,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_1a8,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_1b8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_1c8,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_1d8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_1e8,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_1f8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_208,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_218,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_228,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_238,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_248,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_258,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_268,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_278,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_288,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_298,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_2a8,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_2b8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_2c8,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_2d8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr(&local_2e8,SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr(&local_2f8,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  ss_01 = (SQSharedState *)in_RDI[2];
  sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_318 + 0x10),SVar3 - 1);
  SQTable::NewSlot(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  this_01 = (SQTable *)*in_RDI;
  pSVar2 = SQString::Create(in_stack_fffffffffffff900,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  funcz = (SQRegFunction *)local_318;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)funcz,pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)in_stack_fffffffffffff900,
             (SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  val = sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  this_00 = &local_328;
  ::SQObjectPtr::SQObjectPtr(this_00,SVar3 - 1);
  SQTable::NewSlot(this_01,this_00,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  ss_00 = (SQSharedState *)*in_RDI;
  pSVar2 = SQString::Create(ss_00,(SQChar *)in_stack_fffffffffffff8f8,
                            (SQInteger)in_stack_fffffffffffff8f0);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_348 + 0x10),pSVar2);
  sqvector<SQObjectPtr>::push_back
            ((sqvector<SQObjectPtr> *)ss_00,(SQObjectPtr *)in_stack_fffffffffffff8f8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff8f0);
  nInitialSize = in_RDI[2];
  ss = (SQSharedState *)sqvector<SQObjectPtr>::back((sqvector<SQObjectPtr> *)*in_RDI);
  SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)*in_RDI);
  x = (SQTable *)local_348;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)x,SVar3 - 1);
  SQTable::NewSlot(this_01,this_00,val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)ss);
  SQString::Create(ss_00,(SQChar *)x,(SQInteger)ss);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,(SQString *)x);
  SQTable::Create(ss,nInitialSize);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  SQTable::Create(ss,nInitialSize);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  CreateDefaultDelegate(ss_01,funcz);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss_00,x);
  return;
}

Assistant:

void SQSharedState::Init()
{
    _scratchpad=NULL;
    _scratchpadsize=0;
#ifndef NO_GARBAGE_COLLECTOR
    _gc_chain=NULL;
#endif
    _stringtable = (SQStringTable*)SQ_MALLOC(sizeof(SQStringTable));
    new (_stringtable) SQStringTable(this);
    sq_new(_metamethods,SQObjectPtrVec);
    sq_new(_systemstrings,SQObjectPtrVec);
    sq_new(_types,SQObjectPtrVec);
    _metamethodsmap = SQTable::Create(this,MT_LAST-1);
    //adding type strings to avoid memory trashing
    //types names
    newsysstring(_SC("null"));
    newsysstring(_SC("table"));
    newsysstring(_SC("array"));
    newsysstring(_SC("closure"));
    newsysstring(_SC("string"));
    newsysstring(_SC("userdata"));
    newsysstring(_SC("integer"));
    newsysstring(_SC("float"));
    newsysstring(_SC("userpointer"));
    newsysstring(_SC("function"));
    newsysstring(_SC("generator"));
    newsysstring(_SC("thread"));
    newsysstring(_SC("class"));
    newsysstring(_SC("instance"));
    newsysstring(_SC("bool"));
    //meta methods
    newmetamethod(MM_ADD);
    newmetamethod(MM_SUB);
    newmetamethod(MM_MUL);
    newmetamethod(MM_DIV);
    newmetamethod(MM_UNM);
    newmetamethod(MM_MODULO);
    newmetamethod(MM_SET);
    newmetamethod(MM_GET);
    newmetamethod(MM_TYPEOF);
    newmetamethod(MM_NEXTI);
    newmetamethod(MM_CMP);
    newmetamethod(MM_CALL);
    newmetamethod(MM_CLONED);
    newmetamethod(MM_NEWSLOT);
    newmetamethod(MM_DELSLOT);
    newmetamethod(MM_TOSTRING);
    newmetamethod(MM_NEWMEMBER);
    newmetamethod(MM_INHERITED);

    _constructoridx = SQString::Create(this,_SC("constructor"));
    _registry = SQTable::Create(this,0);
    _consts = SQTable::Create(this,0);
    _table_default_delegate = CreateDefaultDelegate(this,_table_default_delegate_funcz);
    _array_default_delegate = CreateDefaultDelegate(this,_array_default_delegate_funcz);
    _string_default_delegate = CreateDefaultDelegate(this,_string_default_delegate_funcz);
    _number_default_delegate = CreateDefaultDelegate(this,_number_default_delegate_funcz);
    _closure_default_delegate = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
    _generator_default_delegate = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
    _thread_default_delegate = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
    _class_default_delegate = CreateDefaultDelegate(this,_class_default_delegate_funcz);
    _instance_default_delegate = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
    _weakref_default_delegate = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
}